

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdcDec.c
# Opt level: O0

int Bdc_DecomposeFindInitialVarSet(Bdc_Man_t *p,Bdc_Isf_t *pIsf,Bdc_Isf_t *pIsfL,Bdc_Isf_t *pIsfR)

{
  int iVar1;
  int local_58;
  int local_54;
  int End;
  int Beg;
  int nVars;
  int v;
  char pVars [16];
  Bdc_Isf_t *pIsfR_local;
  Bdc_Isf_t *pIsfL_local;
  Bdc_Isf_t *pIsf_local;
  Bdc_Man_t *p_local;
  
  if (pIsfL->uSupp != 0) {
    __assert_fail("pIsfL->uSupp == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/bdc/bdcDec.c"
                  ,0xd5,
                  "int Bdc_DecomposeFindInitialVarSet(Bdc_Man_t *, Bdc_Isf_t *, Bdc_Isf_t *, Bdc_Isf_t *)"
                 );
  }
  if (pIsfR->uSupp == 0) {
    End = 0;
    for (Beg = 0; Beg < p->nVars; Beg = Beg + 1) {
      if ((pIsf->uSupp & 1 << ((byte)Beg & 0x1f)) != 0) {
        *(byte *)((long)&nVars + (long)End) = (byte)Beg;
        End = End + 1;
      }
    }
    local_54 = 0;
    do {
      if (End <= local_54) {
        return 0;
      }
      Kit_TruthExistNew(p->puTemp1,pIsf->puOff,p->nVars,
                        (int)*(char *)((long)&nVars + (long)local_54));
      local_58 = End;
      while (local_58 = local_58 + -1, local_54 < local_58) {
        Kit_TruthExistNew(p->puTemp2,pIsf->puOff,p->nVars,
                          (int)*(char *)((long)&nVars + (long)local_58));
        iVar1 = Kit_TruthIsDisjoint3(pIsf->puOn,p->puTemp1,p->puTemp2,p->nVars);
        if (iVar1 != 0) {
          pIsfL->uUniq = 1 << (*(byte *)((long)&nVars + (long)local_54) & 0x1f);
          pIsfR->uUniq = 1 << (*(byte *)((long)&nVars + (long)local_58) & 0x1f);
          return 1;
        }
      }
      local_54 = local_54 + 1;
    } while( true );
  }
  __assert_fail("pIsfR->uSupp == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/bdc/bdcDec.c"
                ,0xd6,
                "int Bdc_DecomposeFindInitialVarSet(Bdc_Man_t *, Bdc_Isf_t *, Bdc_Isf_t *, Bdc_Isf_t *)"
               );
}

Assistant:

int Bdc_DecomposeFindInitialVarSet( Bdc_Man_t * p, Bdc_Isf_t * pIsf, Bdc_Isf_t * pIsfL, Bdc_Isf_t * pIsfR )
{
    char pVars[16];
    int v, nVars, Beg, End;

    assert( pIsfL->uSupp == 0 );
    assert( pIsfR->uSupp == 0 );

    // fill in the variables
    nVars = 0;
    for ( v = 0; v < p->nVars; v++ )
        if ( pIsf->uSupp & (1 << v) )
            pVars[nVars++] = v;

    // try variable pairs
    for ( Beg = 0; Beg < nVars; Beg++ )
    {
        Kit_TruthExistNew( p->puTemp1, pIsf->puOff, p->nVars, pVars[Beg] ); 
        for ( End = nVars - 1; End > Beg; End-- )
        {
            Kit_TruthExistNew( p->puTemp2, pIsf->puOff, p->nVars, pVars[End] ); 
            if ( Kit_TruthIsDisjoint3(pIsf->puOn, p->puTemp1, p->puTemp2, p->nVars) )
            {
                pIsfL->uUniq = (1 << pVars[Beg]);
                pIsfR->uUniq = (1 << pVars[End]);
                return 1;
            }
        }
    }
    return 0;
}